

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O2

OPJ_BOOL opj_tcd_decode_tile(opj_tcd_t *p_tcd,OPJ_UINT32 win_x0,OPJ_UINT32 win_y0,OPJ_UINT32 win_x1,
                            OPJ_UINT32 win_y1,OPJ_UINT32 numcomps_to_decode,
                            OPJ_UINT32 *comps_indices,OPJ_BYTE *p_src,OPJ_UINT32 p_max_length,
                            OPJ_UINT32 p_tile_no,opj_codestream_index_t *p_cstr_index,
                            opj_event_mgr_t *p_manager)

{
  uint *puVar1;
  uint *puVar2;
  float __x;
  int iVar3;
  int iVar4;
  opj_tcd_resolution_t *poVar5;
  opj_tcd_tile_t *poVar6;
  opj_tcp_t *poVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  OPJ_UINT32 OVar14;
  OPJ_BOOL OVar15;
  int iVar16;
  OPJ_BOOL *pOVar17;
  opj_t2_t *p_t2;
  opj_mutex_t *p_manager_mutex;
  opj_image_t *poVar18;
  void *pvVar19;
  OPJ_BYTE **pData;
  opj_tcd_resolution_t *poVar20;
  long lVar21;
  byte bVar22;
  uint uVar23;
  char *fmt;
  OPJ_INT32 *c2;
  OPJ_FLOAT32 *c2_00;
  opj_tccp_t *poVar24;
  uint uVar25;
  ulong uVar26;
  OPJ_INT32 *c1;
  OPJ_FLOAT32 *c1_00;
  OPJ_FLOAT32 *c0;
  long lVar27;
  OPJ_SIZE_T OVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  OPJ_UINT32 *pOVar32;
  opj_tcd_tilecomp_t *poVar33;
  uint uVar34;
  opj_image_comp_t *poVar35;
  OPJ_UINT32 *pOVar36;
  OPJ_INT32 *pOVar37;
  int iVar38;
  OPJ_SIZE_T n;
  ulong uVar39;
  OPJ_BOOL local_74;
  ulong local_70;
  uint local_64;
  uint local_60;
  OPJ_UINT32 l_data_read;
  ulong local_58;
  opj_image_comp_t *local_50;
  opj_tcd_tilecomp_t *local_48;
  opj_tcd_tile_t *local_40;
  long local_38;
  
  p_tcd->tcd_tileno = p_tile_no;
  p_tcd->tcp = p_tcd->cp->tcps + p_tile_no;
  p_tcd->win_x0 = win_x0;
  p_tcd->win_y0 = win_y0;
  p_tcd->win_x1 = win_x1;
  p_tcd->win_y1 = win_y1;
  p_tcd->whole_tile_decoding = 1;
  opj_free(p_tcd->used_component);
  p_tcd->used_component = (OPJ_BOOL *)0x0;
  if (numcomps_to_decode != 0) {
    pOVar17 = (OPJ_BOOL *)opj_calloc(4,(ulong)p_tcd->image->numcomps);
    if (pOVar17 == (OPJ_BOOL *)0x0) {
      return 0;
    }
    for (uVar26 = 0; numcomps_to_decode != uVar26; uVar26 = uVar26 + 1) {
      pOVar17[comps_indices[uVar26]] = 1;
    }
    p_tcd->used_component = pOVar17;
  }
  lVar27 = 1;
  lVar29 = 0;
  uVar26 = 0;
  while( true ) {
    poVar18 = p_tcd->image;
    uVar39 = (ulong)poVar18->numcomps;
    if (uVar39 <= uVar26) break;
    if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar26] != 0)) {
      poVar33 = p_tcd->tcd_image->tiles->comps;
      poVar35 = poVar18->comps;
      uVar34 = *(uint *)((long)&poVar33->x0 + lVar29);
      local_70 = uVar26;
      uVar10 = opj_uint_ceildiv(p_tcd->win_x0,*(OPJ_UINT32 *)((long)poVar35 + lVar27 * 4 + -4));
      if (uVar10 < uVar34) {
        uVar10 = uVar34;
      }
      uVar34 = *(uint *)((long)&poVar33->y0 + lVar29);
      uVar11 = opj_uint_ceildiv(p_tcd->win_y0,(&poVar35->dx)[lVar27]);
      if (uVar11 < uVar34) {
        uVar11 = uVar34;
      }
      uVar34 = *(uint *)((long)&poVar33->x1 + lVar29);
      uVar12 = opj_uint_ceildiv(p_tcd->win_x1,*(OPJ_UINT32 *)((long)poVar35 + lVar27 * 4 + -4));
      if (uVar34 < uVar12) {
        uVar12 = uVar34;
      }
      uVar34 = *(uint *)((long)&poVar33->y1 + lVar29);
      uVar13 = opj_uint_ceildiv(p_tcd->win_y1,(&poVar35->dx)[lVar27]);
      if (uVar34 < uVar13) {
        uVar13 = uVar34;
      }
      puVar1 = (uint *)((long)&poVar33->x0 + lVar29);
      if (((((uVar10 < *puVar1) ||
            (puVar2 = (uint *)((long)&poVar33->y0 + lVar29), uVar11 < *puVar2)) ||
           (uVar34 = *(uint *)((long)&poVar33->x1 + lVar29), uVar34 < uVar12)) ||
          (uVar25 = *(uint *)((long)&poVar33->y1 + lVar29), uVar25 < uVar13)) ||
         ((uVar23 = *(int *)((long)&poVar33->numresolutions + lVar29) -
                    *(int *)((long)&poVar33->minimum_num_resolutions + lVar29), uVar26 = local_70,
          uVar23 < 0x20 &&
          (((bVar22 = (byte)uVar23, uVar10 - *puVar1 >> (bVar22 & 0x1f) != 0 ||
            (uVar11 - *puVar2 >> (bVar22 & 0x1f) != 0)) ||
           ((uVar34 - uVar12 >> (bVar22 & 0x1f) != 0 || (uVar25 - uVar13 >> (bVar22 & 0x1f) != 0))))
          )))) {
        p_tcd->whole_tile_decoding = 0;
        goto LAB_0013ddff;
      }
    }
    uVar26 = uVar26 + 1;
    lVar29 = lVar29 + 0x70;
    lVar27 = lVar27 + 0x10;
  }
  if (p_tcd->whole_tile_decoding == 0) {
LAB_0013ddff:
    for (uVar26 = 0; poVar18 = p_tcd->image, uVar26 < poVar18->numcomps; uVar26 = uVar26 + 1) {
      poVar33 = p_tcd->tcd_image->tiles->comps + uVar26;
      poVar35 = poVar18->comps + uVar26;
      if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar26] != 0)) {
        uVar34 = poVar33->x0;
        OVar14 = opj_uint_ceildiv(p_tcd->win_x0,poVar35->dx);
        if (OVar14 < uVar34) {
          OVar14 = uVar34;
        }
        poVar33->win_x0 = OVar14;
        uVar34 = poVar33->y0;
        OVar14 = opj_uint_ceildiv(p_tcd->win_y0,poVar35->dy);
        if (OVar14 < uVar34) {
          OVar14 = uVar34;
        }
        poVar33->win_y0 = OVar14;
        uVar34 = poVar33->x1;
        OVar14 = opj_uint_ceildiv(p_tcd->win_x1,poVar35->dx);
        if (uVar34 < OVar14) {
          OVar14 = uVar34;
        }
        poVar33->win_x1 = OVar14;
        uVar34 = poVar33->y1;
        OVar14 = opj_uint_ceildiv(p_tcd->win_y1,poVar35->dy);
        if (uVar34 < OVar14) {
          OVar14 = uVar34;
        }
        poVar33->win_y1 = OVar14;
        uVar34 = poVar33->win_x0;
        uVar10 = poVar33->win_x1;
        if ((uVar10 < uVar34) || (uVar11 = poVar33->win_y0, OVar14 < uVar11)) {
          fmt = "Invalid tilec->win_xxx values\n";
          goto LAB_0013df34;
        }
        uVar12 = poVar33->numresolutions;
        uVar39 = (ulong)uVar12;
        for (lVar27 = 0; uVar12 = uVar12 - 1, uVar39 * 0xc0 - lVar27 != 0; lVar27 = lVar27 + 0xc0) {
          bVar22 = (byte)uVar12;
          poVar5 = poVar33->resolutions;
          uVar30 = ~(-1L << (bVar22 & 0x3f));
          *(int *)((long)&poVar5->win_x0 + lVar27) = (int)(uVar30 + uVar34 >> (bVar22 & 0x3f));
          *(int *)((long)&poVar5->win_y0 + lVar27) = (int)(uVar30 + uVar11 >> (bVar22 & 0x3f));
          *(int *)((long)&poVar5->win_x1 + lVar27) = (int)(uVar30 + uVar10 >> (bVar22 & 0x3f));
          *(int *)((long)&poVar5->win_y1 + lVar27) = (int)(uVar30 + OVar14 >> (bVar22 & 0x3f));
        }
      }
    }
  }
  else {
    lVar27 = 0;
    for (uVar26 = 0; uVar26 < uVar39; uVar26 = uVar26 + 1) {
      poVar33 = p_tcd->tcd_image->tiles->comps;
      lVar29 = *(long *)((long)&poVar33->resolutions + lVar27);
      lVar31 = (ulong)(*(int *)((long)&poVar33->minimum_num_resolutions + lVar27) - 1) * 0xc0;
      if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar26] != 0)) {
        uVar39 = (long)*(int *)(lVar29 + 8 + lVar31) - (long)*(int *)(lVar29 + lVar31);
        iVar16 = *(int *)(lVar29 + 0xc + lVar31) - *(int *)(lVar29 + 4 + lVar31);
        if (((iVar16 != 0) &&
            (auVar8._8_8_ = 0, auVar8._0_8_ = (long)iVar16, auVar9._8_8_ = 0, auVar9._0_8_ = uVar39,
            SUB168(auVar8 * auVar9,8) != 0)) ||
           (uVar39 = (long)iVar16 * uVar39, 0x3fffffffffffffff < uVar39)) goto LAB_0013e401;
        *(ulong *)((long)&poVar33->data_size_needed + lVar27) = uVar39 * 4;
        OVar15 = opj_alloc_tile_component_data((opj_tcd_tilecomp_t *)((long)&poVar33->x0 + lVar27));
        if (OVar15 == 0) goto LAB_0013e401;
        poVar18 = p_tcd->image;
        uVar39 = (ulong)poVar18->numcomps;
      }
      lVar27 = lVar27 + 0x70;
    }
  }
  l_data_read = 0;
  p_t2 = opj_t2_create(poVar18,p_tcd->cp);
  if (p_t2 == (opj_t2_t *)0x0) {
    return 0;
  }
  OVar15 = opj_t2_decode_packets
                     (p_tcd,p_t2,p_tcd->tcd_tileno,p_tcd->tcd_image->tiles,p_src,&l_data_read,
                      p_max_length,p_cstr_index,p_manager);
  opj_t2_destroy(p_t2);
  if (OVar15 == 0) {
    return 0;
  }
  poVar6 = p_tcd->tcd_image->tiles;
  poVar33 = poVar6->comps;
  poVar24 = p_tcd->tcp->tccps;
  local_74 = 1;
  p_manager_mutex = opj_mutex_create();
  uVar34 = 0;
  if (p_tcd->tcp->num_layers_to_decode == p_tcd->tcp->numlayers) {
    uVar34 = poVar24->cblksty >> 4 & 1;
  }
  uVar26 = 0;
  while ((uVar26 < poVar6->numcomps &&
         (((p_tcd->used_component != (OPJ_BOOL *)0x0 && (p_tcd->used_component[uVar26] == 0)) ||
          (opj_t1_decode_cblks(p_tcd,&local_74,poVar33,poVar24,p_manager,p_manager_mutex,uVar34),
          local_74 != 0))))) {
    uVar26 = uVar26 + 1;
    poVar33 = poVar33 + 1;
    poVar24 = poVar24 + 1;
  }
  opj_thread_pool_wait_completion(p_tcd->thread_pool,0);
  if (p_manager_mutex != (opj_mutex_t *)0x0) {
    opj_mutex_destroy(p_manager_mutex);
  }
  if (local_74 == 0) {
    return 0;
  }
  if (p_tcd->whole_tile_decoding == 0) {
    lVar27 = 0x14;
    lVar29 = 9;
    for (uVar26 = 0; poVar18 = p_tcd->image, uVar26 < poVar18->numcomps; uVar26 = uVar26 + 1) {
      poVar33 = p_tcd->tcd_image->tiles->comps;
      lVar21 = (ulong)(&poVar18->comps->dx)[lVar29] * 0xc0;
      lVar31 = *(long *)((long)poVar33 + lVar27 * 4 + -0x30);
      iVar16 = *(int *)(lVar31 + 0xb8 + lVar21);
      iVar38 = *(int *)(lVar31 + 0xb0 + lVar21);
      iVar3 = *(int *)(lVar31 + 0xb4 + lVar21);
      iVar4 = *(int *)(lVar31 + 0xbc + lVar21);
      opj_image_data_free(*(void **)(&poVar33->x0 + lVar27));
      *(undefined8 *)(&poVar33->x0 + lVar27) = 0;
      if (((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar26] != 0)) &&
         (iVar4 != iVar3 && iVar16 != iVar38)) {
        uVar39 = (ulong)(uint)(iVar4 - iVar3) * (ulong)(uint)(iVar16 - iVar38);
        if (0x3fffffffffffffff < uVar39) goto LAB_0013e401;
        pvVar19 = opj_image_data_alloc(uVar39 * 4);
        *(void **)(&poVar33->x0 + lVar27) = pvVar19;
        if (pvVar19 == (void *)0x0) goto LAB_0013e401;
      }
      lVar27 = lVar27 + 0x1c;
      lVar29 = lVar29 + 0x10;
    }
  }
  else {
    poVar18 = p_tcd->image;
  }
  poVar6 = p_tcd->tcd_image->tiles;
  poVar33 = poVar6->comps;
  pOVar36 = &p_tcd->tcp->tccps->qmfbid;
  pOVar32 = &poVar18->comps->resno_decoded;
  for (uVar26 = 0; uVar26 < poVar6->numcomps; uVar26 = uVar26 + 1) {
    if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar26] != 0)) {
      if (*pOVar36 == 1) {
        iVar16 = opj_dwt_decode(p_tcd,poVar33,*pOVar32 + 1);
      }
      else {
        iVar16 = opj_dwt_decode_real(p_tcd,poVar33,*pOVar32 + 1);
      }
      if (iVar16 == 0) {
        return 0;
      }
    }
    poVar33 = poVar33 + 1;
    pOVar36 = pOVar36 + 0x10e;
    pOVar32 = pOVar32 + 0x10;
  }
  poVar7 = p_tcd->tcp;
  if ((poVar7->mct == 0) || (p_tcd->used_component != (OPJ_BOOL *)0x0)) goto LAB_0013e54e;
  poVar6 = p_tcd->tcd_image->tiles;
  poVar33 = poVar6->comps;
  iVar16 = p_tcd->whole_tile_decoding;
  poVar5 = poVar33->resolutions;
  if (iVar16 == 0) {
    uVar34 = poVar6->numcomps;
    if (2 < uVar34) {
      poVar35 = p_tcd->image->comps;
      uVar10 = poVar35->resno_decoded;
      uVar11 = poVar35[2].resno_decoded;
      if (uVar10 == uVar11 && poVar35[1].resno_decoded == uVar10) {
        n = (ulong)(poVar5[uVar10].win_y1 - poVar5[uVar10].win_y0) *
            (ulong)(poVar5[uVar10].win_x1 - poVar5[uVar10].win_x0);
        poVar5 = poVar33[1].resolutions;
        if ((ulong)(poVar5[uVar10].win_y1 - poVar5[uVar10].win_y0) *
            (ulong)(poVar5[uVar10].win_x1 - poVar5[uVar10].win_x0) - n == 0) {
          poVar5 = poVar33[2].resolutions;
          OVar28 = (ulong)(poVar5[uVar11].win_y1 - poVar5[uVar11].win_y0) *
                   (ulong)(poVar5[uVar11].win_x1 - poVar5[uVar11].win_x0);
LAB_0013e4d1:
          if (OVar28 == n) {
            if (poVar7->mct == 2) {
              if (poVar7->m_mct_decoding_matrix != (OPJ_FLOAT32 *)0x0) {
                pData = (OPJ_BYTE **)opj_malloc((ulong)uVar34 << 3);
                if (pData == (OPJ_BYTE **)0x0) {
                  return 0;
                }
                uVar34 = poVar6->numcomps;
                for (uVar26 = 0; uVar34 != uVar26; uVar26 = uVar26 + 1) {
                  pData[uVar26] =
                       (OPJ_BYTE *)(&poVar33->data)[(ulong)(p_tcd->whole_tile_decoding == 0) * 4];
                  poVar33 = poVar33 + 1;
                }
                OVar15 = opj_mct_decode_custom
                                   ((OPJ_BYTE *)poVar7->m_mct_decoding_matrix,n,pData,uVar34,
                                    p_tcd->image->comps->sgnd);
                opj_free(pData);
                if (OVar15 == 0) {
                  return 0;
                }
              }
            }
            else if (poVar7->tccps->qmfbid == 1) {
              if (iVar16 == 0) {
                pOVar37 = poVar33->data_win;
                c1 = poVar33[1].data_win;
                c2 = poVar33[2].data_win;
              }
              else {
                pOVar37 = poVar33->data;
                c1 = poVar33[1].data;
                c2 = poVar33[2].data;
              }
              opj_mct_decode(pOVar37,c1,c2,n);
            }
            else {
              if (iVar16 == 0) {
                c0 = (OPJ_FLOAT32 *)poVar33->data_win;
                c1_00 = (OPJ_FLOAT32 *)poVar33[1].data_win;
                c2_00 = (OPJ_FLOAT32 *)poVar33[2].data_win;
              }
              else {
                c0 = (OPJ_FLOAT32 *)poVar33->data;
                c1_00 = (OPJ_FLOAT32 *)poVar33[1].data;
                c2_00 = (OPJ_FLOAT32 *)poVar33[2].data;
              }
              opj_mct_decode_real(c0,c1_00,c2_00,n);
            }
            goto LAB_0013e54e;
          }
        }
      }
      goto LAB_0013e7b2;
    }
  }
  else {
    uVar34 = poVar6->numcomps;
    if (2 < uVar34) {
      uVar10 = poVar33->minimum_num_resolutions;
      if ((uVar10 == poVar33[1].minimum_num_resolutions) &&
         (uVar10 == poVar33[2].minimum_num_resolutions)) {
        poVar35 = p_tcd->image->comps;
        if ((poVar35->resno_decoded == poVar35[1].resno_decoded) &&
           (poVar35->resno_decoded == poVar35[2].resno_decoded)) {
          n = ((long)poVar5[(ulong)uVar10 - 1].y1 - (long)poVar5[(ulong)uVar10 - 1].y0) *
              ((long)poVar5[(ulong)uVar10 - 1].x1 - (long)poVar5[(ulong)uVar10 - 1].x0);
          poVar5 = poVar33[1].resolutions;
          if (((long)poVar5[(ulong)uVar10 - 1].y1 - (long)poVar5[(ulong)uVar10 - 1].y0) *
              ((long)poVar5[(ulong)uVar10 - 1].x1 - (long)poVar5[(ulong)uVar10 - 1].x0) - n == 0) {
            poVar5 = poVar33[2].resolutions;
            OVar28 = ((long)poVar5[(ulong)uVar10 - 1].y1 - (long)poVar5[(ulong)uVar10 - 1].y0) *
                     ((long)poVar5[(ulong)uVar10 - 1].x1 - (long)poVar5[(ulong)uVar10 - 1].x0);
            goto LAB_0013e4d1;
          }
        }
      }
LAB_0013e7b2:
      fmt = "Tiles don\'t all have the same dimension. Skip the MCT step.\n";
LAB_0013df34:
      opj_event_msg(p_manager,1,fmt);
      return 0;
    }
  }
  opj_event_msg(p_manager,1,
                "Number of components (%d) is inconsistent with a MCT. Skip the MCT step.\n");
LAB_0013e54e:
  local_40 = p_tcd->tcd_image->tiles;
  local_48 = local_40->comps;
  poVar24 = p_tcd->tcp->tccps;
  local_50 = p_tcd->image->comps;
  local_58 = 0;
  do {
    if (local_40->numcomps <= local_58) {
      return 1;
    }
    if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[local_58] != 0)) {
      poVar5 = local_48->resolutions;
      poVar20 = poVar5 + local_50->resno_decoded;
      if (p_tcd->whole_tile_decoding == 0) {
        iVar16 = poVar20->win_x1 - poVar20->win_x0;
        uVar34 = poVar20->win_y1 - poVar20->win_y0;
        pOVar37 = local_48->data_win;
        uVar26 = 0;
      }
      else {
        iVar16 = poVar20->x1 - poVar20->x0;
        uVar34 = local_48->minimum_num_resolutions - 1;
        uVar10 = poVar5[uVar34].x1 - poVar5[uVar34].x0;
        uVar26 = (ulong)(uVar10 - iVar16);
        pOVar37 = local_48->data;
        uVar34 = poVar20->y1 - poVar20->y0;
        if (uVar34 == 0) {
          uVar34 = 0;
        }
        else if (local_48->data_size / (ulong)uVar34 < (ulong)uVar10) {
          __assert_fail("l_height == 0 || l_width + l_stride <= l_tile_comp->data_size / l_height",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cinecert[P]openjpeg/src/lib/openjp2/tcd.c"
                        ,0x903,"OPJ_BOOL opj_tcd_dc_level_shift_decode(opj_tcd_t *)");
        }
      }
      bVar22 = (byte)local_50->prec;
      if (local_50->sgnd == 0) {
        uVar11 = ~(-1 << (bVar22 & 0x1f));
        uVar10 = 0;
      }
      else {
        iVar38 = 1 << (bVar22 - 1 & 0x1f);
        uVar10 = -iVar38;
        uVar11 = iVar38 - 1;
      }
      if (poVar24->qmfbid == 1) {
        for (uVar12 = 0; uVar12 != uVar34; uVar12 = uVar12 + 1) {
          lVar27 = uVar26 * -4;
          for (lVar29 = 0; iVar16 != (int)lVar29; lVar29 = lVar29 + 1) {
            uVar25 = poVar24->m_dc_level_shift + pOVar37[lVar29];
            uVar13 = uVar11;
            if ((int)uVar25 < (int)uVar11) {
              uVar13 = uVar25;
            }
            if ((int)uVar25 < (int)uVar10) {
              uVar13 = uVar10;
            }
            pOVar37[lVar29] = uVar13;
            lVar27 = lVar27 + -4;
          }
          pOVar37 = (OPJ_INT32 *)((long)pOVar37 - lVar27);
        }
      }
      else {
        local_70 = (ulong)(int)uVar10;
        local_38 = uVar26 * -4;
        uVar12 = 0;
        local_64 = uVar34;
        while (uVar12 != local_64) {
          lVar27 = local_38;
          local_60 = uVar12;
          for (lVar29 = 0; iVar16 != (int)lVar29; lVar29 = lVar29 + 1) {
            __x = (float)pOVar37[lVar29];
            uVar34 = uVar11;
            if ((__x <= 2.1474836e+09) && (uVar34 = uVar10, -2.1474836e+09 <= __x)) {
              lVar21 = lrintf(__x);
              lVar21 = poVar24->m_dc_level_shift + lVar21;
              lVar31 = lVar21;
              if ((int)uVar11 <= lVar21) {
                lVar31 = (long)(int)uVar11;
              }
              uVar34 = (uint)lVar31;
              if (lVar21 < (long)local_70) {
                uVar34 = uVar10;
              }
            }
            pOVar37[lVar29] = uVar34;
            lVar27 = lVar27 + -4;
          }
          pOVar37 = (OPJ_INT32 *)((long)pOVar37 - lVar27);
          uVar12 = local_60 + 1;
        }
      }
    }
    local_58 = local_58 + 1;
    local_50 = local_50 + 1;
    poVar24 = poVar24 + 1;
    local_48 = local_48 + 1;
  } while( true );
LAB_0013e401:
  fmt = "Size of tile data exceeds system limits\n";
  goto LAB_0013df34;
}

Assistant:

OPJ_BOOL opj_tcd_decode_tile(opj_tcd_t *p_tcd,
                             OPJ_UINT32 win_x0,
                             OPJ_UINT32 win_y0,
                             OPJ_UINT32 win_x1,
                             OPJ_UINT32 win_y1,
                             OPJ_UINT32 numcomps_to_decode,
                             const OPJ_UINT32 *comps_indices,
                             OPJ_BYTE *p_src,
                             OPJ_UINT32 p_max_length,
                             OPJ_UINT32 p_tile_no,
                             opj_codestream_index_t *p_cstr_index,
                             opj_event_mgr_t *p_manager
                            )
{
    OPJ_UINT32 l_data_read;
    OPJ_UINT32 compno;

    p_tcd->tcd_tileno = p_tile_no;
    p_tcd->tcp = &(p_tcd->cp->tcps[p_tile_no]);
    p_tcd->win_x0 = win_x0;
    p_tcd->win_y0 = win_y0;
    p_tcd->win_x1 = win_x1;
    p_tcd->win_y1 = win_y1;
    p_tcd->whole_tile_decoding = OPJ_TRUE;

    opj_free(p_tcd->used_component);
    p_tcd->used_component = NULL;

    if (numcomps_to_decode) {
        OPJ_BOOL* used_component = (OPJ_BOOL*) opj_calloc(sizeof(OPJ_BOOL),
                                   p_tcd->image->numcomps);
        if (used_component == NULL) {
            return OPJ_FALSE;
        }
        for (compno = 0; compno < numcomps_to_decode; compno++) {
            used_component[ comps_indices[compno] ] = OPJ_TRUE;
        }

        p_tcd->used_component = used_component;
    }

    for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
        if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
            continue;
        }

        if (!opj_tcd_is_whole_tilecomp_decoding(p_tcd, compno)) {
            p_tcd->whole_tile_decoding = OPJ_FALSE;
            break;
        }
    }

    if (p_tcd->whole_tile_decoding) {
        for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
            opj_tcd_tilecomp_t* tilec = &(p_tcd->tcd_image->tiles->comps[compno]);
            opj_tcd_resolution_t *l_res = &
                                          (tilec->resolutions[tilec->minimum_num_resolutions - 1]);
            OPJ_SIZE_T l_data_size;

            /* compute l_data_size with overflow check */
            OPJ_SIZE_T res_w = (OPJ_SIZE_T)(l_res->x1 - l_res->x0);
            OPJ_SIZE_T res_h = (OPJ_SIZE_T)(l_res->y1 - l_res->y0);

            if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
                continue;
            }

            /* issue 733, l_data_size == 0U, probably something wrong should be checked before getting here */
            if (res_h > 0 && res_w > SIZE_MAX / res_h) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size of tile data exceeds system limits\n");
                return OPJ_FALSE;
            }
            l_data_size = res_w * res_h;

            if (SIZE_MAX / sizeof(OPJ_UINT32) < l_data_size) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size of tile data exceeds system limits\n");
                return OPJ_FALSE;
            }
            l_data_size *= sizeof(OPJ_UINT32);

            tilec->data_size_needed = l_data_size;

            if (!opj_alloc_tile_component_data(tilec)) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size of tile data exceeds system limits\n");
                return OPJ_FALSE;
            }
        }
    } else {
        /* Compute restricted tile-component and tile-resolution coordinates */
        /* of the window of interest, but defer the memory allocation until */
        /* we know the resno_decoded */
        for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
            OPJ_UINT32 resno;
            opj_tcd_tilecomp_t* tilec = &(p_tcd->tcd_image->tiles->comps[compno]);
            opj_image_comp_t* image_comp = &(p_tcd->image->comps[compno]);

            if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
                continue;
            }

            /* Compute the intersection of the area of interest, expressed in tile coordinates */
            /* with the tile coordinates */
            tilec->win_x0 = opj_uint_max(
                                (OPJ_UINT32)tilec->x0,
                                opj_uint_ceildiv(p_tcd->win_x0, image_comp->dx));
            tilec->win_y0 = opj_uint_max(
                                (OPJ_UINT32)tilec->y0,
                                opj_uint_ceildiv(p_tcd->win_y0, image_comp->dy));
            tilec->win_x1 = opj_uint_min(
                                (OPJ_UINT32)tilec->x1,
                                opj_uint_ceildiv(p_tcd->win_x1, image_comp->dx));
            tilec->win_y1 = opj_uint_min(
                                (OPJ_UINT32)tilec->y1,
                                opj_uint_ceildiv(p_tcd->win_y1, image_comp->dy));
            if (tilec->win_x1 < tilec->win_x0 ||
                    tilec->win_y1 < tilec->win_y0) {
                /* We should not normally go there. The circumstance is when */
                /* the tile coordinates do not intersect the area of interest */
                /* Upper level logic should not even try to decode that tile */
                opj_event_msg(p_manager, EVT_ERROR,
                              "Invalid tilec->win_xxx values\n");
                return OPJ_FALSE;
            }

            for (resno = 0; resno < tilec->numresolutions; ++resno) {
                opj_tcd_resolution_t *res = tilec->resolutions + resno;
                res->win_x0 = opj_uint_ceildivpow2(tilec->win_x0,
                                                   tilec->numresolutions - 1 - resno);
                res->win_y0 = opj_uint_ceildivpow2(tilec->win_y0,
                                                   tilec->numresolutions - 1 - resno);
                res->win_x1 = opj_uint_ceildivpow2(tilec->win_x1,
                                                   tilec->numresolutions - 1 - resno);
                res->win_y1 = opj_uint_ceildivpow2(tilec->win_y1,
                                                   tilec->numresolutions - 1 - resno);
            }
        }
    }

#ifdef TODO_MSD /* FIXME */
    /* INDEX >>  */
    if (p_cstr_info) {
        OPJ_UINT32 resno, compno, numprec = 0;
        for (compno = 0; compno < (OPJ_UINT32) p_cstr_info->numcomps; compno++) {
            opj_tcp_t *tcp = &p_tcd->cp->tcps[0];
            opj_tccp_t *tccp = &tcp->tccps[compno];
            opj_tcd_tilecomp_t *tilec_idx = &p_tcd->tcd_image->tiles->comps[compno];
            for (resno = 0; resno < tilec_idx->numresolutions; resno++) {
                opj_tcd_resolution_t *res_idx = &tilec_idx->resolutions[resno];
                p_cstr_info->tile[p_tile_no].pw[resno] = res_idx->pw;
                p_cstr_info->tile[p_tile_no].ph[resno] = res_idx->ph;
                numprec += res_idx->pw * res_idx->ph;
                p_cstr_info->tile[p_tile_no].pdx[resno] = tccp->prcw[resno];
                p_cstr_info->tile[p_tile_no].pdy[resno] = tccp->prch[resno];
            }
        }
        p_cstr_info->tile[p_tile_no].packet = (opj_packet_info_t *) opj_malloc(
                p_cstr_info->numlayers * numprec * sizeof(opj_packet_info_t));
        p_cstr_info->packno = 0;
    }
    /* << INDEX */
#endif

    /*--------------TIER2------------------*/
    /* FIXME _ProfStart(PGROUP_T2); */
    l_data_read = 0;
    if (! opj_tcd_t2_decode(p_tcd, p_src, &l_data_read, p_max_length, p_cstr_index,
                            p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_T2); */

    /*------------------TIER1-----------------*/

    /* FIXME _ProfStart(PGROUP_T1); */
    if (! opj_tcd_t1_decode(p_tcd, p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_T1); */


    /* For subtile decoding, now we know the resno_decoded, we can allocate */
    /* the tile data buffer */
    if (!p_tcd->whole_tile_decoding) {
        for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
            opj_tcd_tilecomp_t* tilec = &(p_tcd->tcd_image->tiles->comps[compno]);
            opj_image_comp_t* image_comp = &(p_tcd->image->comps[compno]);
            opj_tcd_resolution_t *res = tilec->resolutions + image_comp->resno_decoded;
            OPJ_SIZE_T w = res->win_x1 - res->win_x0;
            OPJ_SIZE_T h = res->win_y1 - res->win_y0;
            OPJ_SIZE_T l_data_size;

            opj_image_data_free(tilec->data_win);
            tilec->data_win = NULL;

            if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
                continue;
            }

            if (w > 0 && h > 0) {
                if (w > SIZE_MAX / h) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Size of tile data exceeds system limits\n");
                    return OPJ_FALSE;
                }
                l_data_size = w * h;
                if (l_data_size > SIZE_MAX / sizeof(OPJ_INT32)) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Size of tile data exceeds system limits\n");
                    return OPJ_FALSE;
                }
                l_data_size *= sizeof(OPJ_INT32);

                tilec->data_win = (OPJ_INT32*) opj_image_data_alloc(l_data_size);
                if (tilec->data_win == NULL) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Size of tile data exceeds system limits\n");
                    return OPJ_FALSE;
                }
            }
        }
    }

    /*----------------DWT---------------------*/

    /* FIXME _ProfStart(PGROUP_DWT); */
    if
    (! opj_tcd_dwt_decode(p_tcd)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_DWT); */

    /*----------------MCT-------------------*/
    /* FIXME _ProfStart(PGROUP_MCT); */
    if
    (! opj_tcd_mct_decode(p_tcd, p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_MCT); */

    /* FIXME _ProfStart(PGROUP_DC_SHIFT); */
    if
    (! opj_tcd_dc_level_shift_decode(p_tcd)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_DC_SHIFT); */


    /*---------------TILE-------------------*/
    return OPJ_TRUE;
}